

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O1

int XLearnGetTXTModel(XL *out,string *model_path)

{
  std::__cxx11::string::_M_assign((string *)model_path);
  return 0;
}

Assistant:

XL_DLL int XLearnGetTXTModel(XL *out, std::string& model_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  model_path = xl->GetHyperParam().txt_model_file;
  API_END();
}